

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O3

size_t axl::enc::EscapeEncodingDynamic::decode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size)

{
  int c;
  size_t sVar1;
  ulong *puVar2;
  long lVar3;
  int iVar4;
  ulong *puVar5;
  ulong *puVar6;
  undefined1 auVar7 [16];
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  utf32_t replace;
  uint32_t decoderState;
  ulong_t hexCode;
  char hexCodeString [16];
  utf32_t decodeBuffer [64];
  ulong *local_1d0;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> local_1c8;
  Array<char,_axl::sl::ArrayDetails<char>_> *local_1a0;
  CharCodec *local_198;
  Array<char,_axl::sl::ArrayDetails<char>_> *local_190;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_188;
  utf32_t local_170 [2];
  ulong local_168;
  void *local_160;
  void *local_158;
  long local_150;
  char local_148 [16];
  ulong local_138 [33];
  
  iVar4 = 0;
  local_198 = codec;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,0);
  local_1a0 = buffer;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(buffer,size);
  local_188.m_p = (char *)0x0;
  local_188.m_hdr = (Hdr *)0x0;
  local_188.m_count = 0;
  local_170[1] = 0;
  if (0 < (long)size) {
    local_160 = (void *)(size + (long)p0);
    do {
      auVar7 = (**(code **)(*(long *)local_198 + 0x98))
                         (local_198,local_170 + 1,local_138,0x40,p0,(long)local_160 - (long)p0,
                          0xfffd);
      lVar3 = auVar7._8_8_;
      if (lVar3 == 0) break;
      local_158 = p0;
      local_150 = lVar3;
      if (auVar7._0_8_ < 1) {
        puVar5 = local_138;
        local_1d0 = puVar5;
      }
      else {
        puVar5 = local_138;
        puVar6 = puVar5;
        local_1d0 = puVar5;
        do {
          c = (int)*puVar5;
          if (iVar4 == 2) {
            if ((c - 0x30U < 10) ||
               ((puVar2 = puVar5, c - 0x41U < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(c - 0x41U) & 0x3f) & 1) != 0)))) {
              local_148[(long)buffer] = (char)c;
              buffer = (Array<char,_axl::sl::ArrayDetails<char>_> *)
                       ((long)&(buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p + 1)
              ;
              iVar4 = 2;
              if (buffer < local_190) goto LAB_0014c905;
              puVar2 = (ulong *)((long)puVar5 + 4);
            }
            local_1d0 = puVar2;
            local_148[(long)buffer] = '\0';
            local_168 = strtoul(local_148,(char **)0x0,0x10);
            if (local_190 == (Array<char,_axl::sl::ArrayDetails<char>_> *)0x2) {
              sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (local_1a0,0xffffffffffffffff,(char *)&local_168,1);
              iVar4 = 0;
              local_190 = (Array<char,_axl::sl::ArrayDetails<char>_> *)0x2;
            }
            else {
              local_1c8.m_length._0_1_ = 0;
              local_1c8.m_length._1_7_ = 0;
              local_1c8.m_isNullTerminated = false;
              local_1c8.m_p = (C *)0x0;
              local_1c8.m_hdr._0_1_ = 0;
              local_1c8.m_hdr._1_7_ = 0;
              sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                        (&local_1c8,(BufHdr *)0x0);
              local_1c8.m_p = (C *)&local_168;
              local_1c8.m_length._0_1_ = 1;
              local_1c8.m_length._1_7_ = 0;
              local_1c8.m_isNullTerminated = false;
              CharCodec::encode_utf32
                        (local_198,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,
                         &local_1c8,0xfffd);
              sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1c8);
              sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (local_1a0,0xffffffffffffffff,local_188.m_p,local_188.m_count);
LAB_0014c903:
              iVar4 = 0;
            }
          }
          else if (iVar4 == 1) {
            iVar4 = 2;
            if (c == 0x55) {
              local_190 = (Array<char,_axl::sl::ArrayDetails<char>_> *)0x8;
            }
            else if (c == 0x78) {
              local_190 = (Array<char,_axl::sl::ArrayDetails<char>_> *)0x2;
            }
            else {
              if (c != 0x75) {
                local_170[0] = EscapeEncodingRoot::findEscapeReplaceChar(c);
                local_1d0 = puVar5;
                if (local_170[0] != c) {
                  local_1c8.m_length._0_1_ = 0;
                  local_1c8.m_length._1_7_ = 0;
                  local_1c8.m_isNullTerminated = false;
                  local_1c8.m_p = (C *)0x0;
                  local_1c8.m_hdr._0_1_ = 0;
                  local_1c8.m_hdr._1_7_ = 0;
                  sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                            (&local_1c8,(BufHdr *)0x0);
                  local_1c8.m_p = local_170;
                  local_1c8.m_length._0_1_ = 1;
                  local_1c8.m_length._1_7_ = 0;
                  local_1c8.m_isNullTerminated = false;
                  CharCodec::encode_utf32
                            (local_198,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,
                             &local_1c8,0xfffd);
                  sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
                            (&local_1c8);
                  sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                            (local_1a0,0xffffffffffffffff,local_188.m_p,local_188.m_count);
                  local_1d0 = (ulong *)((long)puVar5 + 4);
                }
                goto LAB_0014c903;
              }
              local_190 = (Array<char,_axl::sl::ArrayDetails<char>_> *)0x4;
            }
            buffer = (Array<char,_axl::sl::ArrayDetails<char>_> *)0x0;
          }
          else if (iVar4 == 0) {
            if (c != 0x5c) goto LAB_0014c903;
            local_1c8.m_length._0_1_ = 0;
            local_1c8.m_length._1_7_ = 0;
            local_1c8.m_isNullTerminated = false;
            local_1c8.m_p = (C *)0x0;
            local_1c8.m_hdr._0_1_ = 0;
            local_1c8.m_hdr._1_7_ = 0;
            sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                      (&local_1c8,(BufHdr *)0x0);
            local_1c8.m_p = (C *)local_1d0;
            local_1c8.m_length._0_1_ = (undefined1)((long)puVar6 - (long)local_1d0 >> 2);
            local_1c8.m_length._1_7_ = (int7)((long)puVar6 - (long)local_1d0 >> 10);
            local_1c8.m_isNullTerminated = false;
            CharCodec::encode_utf32
                      (local_198,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,&local_1c8,
                       0xfffd);
            sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1c8);
            iVar4 = 1;
            sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                      (local_1a0,0xffffffffffffffff,local_188.m_p,local_188.m_count);
          }
LAB_0014c905:
          puVar5 = (ulong *)((long)puVar5 + 4);
          puVar6 = (ulong *)((long)puVar6 + 4);
        } while (puVar5 < (ulong *)((long)local_138 + auVar7._0_8_ * 4));
      }
      lVar3 = local_150;
      if (iVar4 == 0) {
        local_1c8.m_length._0_1_ = 0;
        local_1c8.m_length._1_7_ = 0;
        local_1c8.m_isNullTerminated = false;
        local_1c8.m_p = (C *)0x0;
        local_1c8.m_hdr._0_1_ = 0;
        local_1c8.m_hdr._1_7_ = 0;
        sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
                  (&local_1c8,(BufHdr *)0x0);
        local_1c8.m_p = (C *)local_1d0;
        local_1c8.m_length._0_1_ = (undefined1)((long)puVar5 - (long)local_1d0 >> 2);
        local_1c8.m_length._1_7_ = (int7)((long)puVar5 - (long)local_1d0 >> 10);
        local_1c8.m_isNullTerminated = false;
        CharCodec::encode_utf32
                  (local_198,(Array<char,_axl::sl::ArrayDetails<char>_> *)&local_188,&local_1c8,
                   0xfffd);
        sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_1c8);
        sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                  (local_1a0,0xffffffffffffffff,local_188.m_p,local_188.m_count);
      }
      p0 = (void *)((long)local_158 + lVar3);
    } while (p0 < local_160);
  }
  sVar1 = (local_1a0->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_188);
  return sVar1;
}

Assistant:

size_t
EscapeEncodingDynamic::decode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size
) {
	enum State {
		State_Normal = 0,
		State_Escape,
		State_Hex,
	};

	State state = State_Normal;

	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char hexCodeString[16];
	size_t hexCodeLen;
	size_t hexCodeMaxLen;
	ulong_t hexCode;

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			switch (state) {
			case State_Normal:
				if (c == '\\') {
					appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
					state = State_Escape;
				}

				break;

			case State_Escape:
				switch (c) {
				case 'x':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 2;
					break;

				case 'u':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 4;
					break;

				case 'U':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 8;
					break;

				default:
					utf32_t replace = findEscapeReplaceChar(c);
					if (replace != c) {
						appendEncoded_utf32(codec, buffer, &encodeBuffer, &replace, 1);
						base = p + 1;
					} else {
						base = p;
					}

					state = State_Normal;
				}

				break;

			case State_Hex:
				if (isHexChar(c)) {
					hexCodeString[hexCodeLen++] = (char)c;
					if (hexCodeLen < hexCodeMaxLen)
						break;

					base = p + 1;
				} else {
					base = p;
				}

				hexCodeString[hexCodeLen] = 0;
				hexCode = strtoul(hexCodeString, NULL, 16);

				if (hexCodeMaxLen == 2) // \x
					buffer->append((const char*)&hexCode, 1);
				else // \u or \U
					appendEncoded_utf32(codec, buffer, &encodeBuffer, (utf32_t*)&hexCode, 1);

				state = State_Normal;
				break;
			}
		}

		if (state == State_Normal) // otherwise, unterminated escape
			appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}